

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * otense(obj *otmp,char *verb)

{
  char *pcVar1;
  
  if ((otmp->quan < 2) && (otmp->oartifact != '\x1d')) {
    pcVar1 = vtense((char *)0x0,verb);
    return pcVar1;
  }
  nextobuf_bufidx = (nextobuf_bufidx + 1) % 0xc;
  pcVar1 = strcpy(nextobuf_bufs + (long)nextobuf_bufidx * 0x100,verb);
  return pcVar1;
}

Assistant:

char *otense(const struct obj *otmp, const char *verb)
{
	char *buf;

	/*
	 * verb is given in plural (without trailing s).  Return as input
	 * if the result of xname(otmp) would be plural.  Don't bother
	 * recomputing xname(otmp) at this time.
	 */
	if (!is_plural(otmp))
	    return vtense(NULL, verb);

	buf = nextobuf();
	strcpy(buf, verb);
	return buf;
}